

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

_Bool flatview_access_valid
                (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,hwaddr len,_Bool is_write,
                MemTxAttrs attrs)

{
  _Bool _Var1;
  uint size;
  hwaddr local_50;
  hwaddr xlat;
  hwaddr l;
  MemoryRegion_conflict *mr;
  hwaddr hStack_30;
  _Bool is_write_local;
  hwaddr len_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  mr._7_1_ = is_write;
  hStack_30 = len;
  len_local = addr;
  addr_local = (hwaddr)fv;
  fv_local = (FlatView *)uc;
  uc_local._0_4_ = attrs;
  do {
    if (hStack_30 == 0) {
      return true;
    }
    xlat = hStack_30;
    l = (hwaddr)flatview_translate_tricore
                          ((uc_struct_conflict15 *)fv_local,(FlatView *)addr_local,len_local,
                           &local_50,&xlat,(_Bool)(mr._7_1_ & 1),uc_local._0_4_);
    _Var1 = memory_access_is_direct((MemoryRegion_conflict *)l,(_Bool)(mr._7_1_ & 1));
    if (!_Var1) {
      size = memory_access_size((MemoryRegion_conflict *)l,(uint)xlat,len_local);
      xlat = (hwaddr)(int)size;
      _Var1 = memory_region_access_valid_tricore
                        ((uc_struct_conflict15 *)fv_local,(MemoryRegion_conflict *)l,local_50,size,
                         (_Bool)(mr._7_1_ & 1),uc_local._0_4_);
      if (!_Var1) {
        return false;
      }
    }
    hStack_30 = hStack_30 - xlat;
    len_local = xlat + len_local;
  } while( true );
}

Assistant:

static bool flatview_access_valid(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr len,
                                  bool is_write, MemTxAttrs attrs)
{
    MemoryRegion *mr;
    hwaddr l, xlat;

    while (len > 0) {
        l = len;
        mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);
        if (!memory_access_is_direct(mr, is_write)) {
            l = memory_access_size(mr, l, addr);
            if (!memory_region_access_valid(uc, mr, xlat, l, is_write, attrs)) {
                return false;
            }
        }

        len -= l;
        addr += l;
    }
    return true;
}